

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::create_object_implicitly
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  semantic_tag sVar1;
  undefined1 local_21;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_20;
  
  sVar1 = tag(this);
  basic_json(&local_20,sVar1,&local_21);
  operator=(this,&local_20);
  ~basic_json(&local_20);
  return;
}

Assistant:

void create_object_implicitly(std::true_type)
        {
            *this = basic_json(json_object_arg, tag());
        }